

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_hint(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  hint *new;
  hint *h;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x10);
  pcVar2 = parser_getstr(p,"text");
  pcVar2 = string_make(pcVar2);
  *v = pcVar2;
  v[1] = pvVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_hint(struct parser *p) {
	struct hint *h = parser_priv(p);
	struct hint *new = mem_zalloc(sizeof *new);

	new->hint = string_make(parser_getstr(p, "text"));
	new->next = h;

	parser_setpriv(p, new);
	return PARSE_ERROR_NONE;
}